

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_optype(lua_State *L,cTValue *o,ErrMsg opm)

{
  char *pcVar1;
  GCproto *pt_00;
  char *pcVar2;
  int in_EDX;
  long in_RSI;
  lua_State *in_RDI;
  char *kind;
  char *oname;
  BCIns *pc;
  GCproto *pt;
  char *opname;
  char *tname;
  uint local_50;
  uint local_4c;
  undefined8 uVar3;
  
  if (*(uint *)(in_RSI + 4) < 0xffff0000) {
    local_4c = 0xd;
  }
  else {
    if (*(int *)(in_RSI + 4) >> 0xf == -2) {
      local_50 = 3;
    }
    else {
      local_50 = *(uint *)(in_RSI + 4) ^ 0xffffffff;
    }
    local_4c = local_50;
  }
  pcVar1 = lj_obj_itypename[local_4c];
  pt_00 = (GCproto *)(lj_err_allmsg + in_EDX);
  if (*(char *)((ulong)in_RDI->base[-1].u32.lo + 6) == '\0') {
    uVar3 = 0;
    pcVar2 = lj_debug_slotname(pt_00,(BCIns *)((ulong)*(uint *)((ulong)in_RDI->base[-1].u32.lo +
                                                               0x10) - 0x40),
                               (BCReg)((ulong)*(uint *)(((ulong)in_RDI->cframe & 0xfffffffffffffffc)
                                                       + 0x1c) - 4 >> 0x20),(char **)0x0);
    if (pcVar2 != (char *)0x0) {
      err_msgv(in_RDI,LJ_ERR_BADOPRT,pt_00,pcVar2,uVar3,pcVar1);
    }
  }
  err_msgv(in_RDI,LJ_ERR_BADOPRV,pt_00,pcVar1);
}

Assistant:

LJ_NOINLINE void lj_err_optype(lua_State *L, cTValue *o, ErrMsg opm)
{
  const char *tname = lj_typename(o);
  const char *opname = err2msg(opm);
  if (curr_funcisL(L)) {
    GCproto *pt = curr_proto(L);
    const BCIns *pc = cframe_Lpc(L) - 1;
    const char *oname = NULL;
    const char *kind = lj_debug_slotname(pt, pc, (BCReg)(o-L->base), &oname);
    if (kind)
      err_msgv(L, LJ_ERR_BADOPRT, opname, kind, oname, tname);
  }
  err_msgv(L, LJ_ERR_BADOPRV, opname, tname);
}